

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall TaprootScriptTree_TreeTest3_Test::TestBody(TaprootScriptTree_TreeTest3_Test *this)

{
  initializer_list<cfd::core::ByteData256> __l;
  initializer_list<cfd::core::ByteData256> __l_00;
  initializer_list<TestScriptTree3Data> __l_01;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  pointer pBVar2;
  bool bVar3;
  ScriptBuilder *pSVar4;
  char *pcVar5;
  reference this_00;
  Script *tapscript;
  reference pvVar6;
  reference rhs;
  size_t *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  const_reference pvVar9;
  reference pvVar10;
  ByteData256 *local_1e48;
  ByteData256 *local_1e30;
  TestScriptTree3Data *local_1e18;
  AssertionResult gtest_ar_33;
  CfdException *except;
  Message local_1bb8;
  string local_1bb0;
  undefined1 local_1b90 [8];
  AssertionResult gtest_ar_32;
  Message local_1b78;
  Script local_1b70;
  string local_1b38;
  undefined1 local_1b18 [8];
  AssertionResult gtest_ar_31;
  allocator local_1ae1;
  string local_1ae0;
  TaprootScriptTree local_1ac0;
  AssertionResult gtest_ar_30;
  CfdException *except_1;
  Message local_1a00;
  undefined1 local_19f8 [8];
  AssertionResult gtest_ar_29;
  size_t index_2;
  Message local_19d8;
  size_type local_19d0;
  size_type local_19c8;
  undefined1 local_19c0 [8];
  AssertionResult gtest_ar_28;
  AssertHelper local_1998;
  Message local_1990;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_1988;
  size_type local_1970;
  undefined1 local_1968 [8];
  AssertionResult gtest_ar_27;
  Message local_1950;
  Script local_1948;
  string local_1910;
  string local_18f0;
  undefined1 local_18d0 [8];
  AssertionResult gtest_ar_26;
  Message local_18b8;
  string local_18b0;
  undefined1 local_1890 [8];
  AssertionResult gtest_ar_25;
  Message local_1878;
  ByteData256 local_1870;
  string local_1858;
  undefined1 local_1838 [8];
  AssertionResult gtest_ar_24;
  string local_1820;
  TaprootScriptTree local_1800;
  AssertHelper local_1770;
  Message local_1768;
  undefined1 local_1760 [8];
  AssertionResult gtest_ar_23;
  size_t index_1;
  Message local_1740;
  size_type local_1738;
  size_type local_1730;
  undefined1 local_1728 [8];
  AssertionResult gtest_ar_22;
  AssertHelper local_1700;
  Message local_16f8;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_16f0;
  size_type local_16d8;
  undefined1 local_16d0 [8];
  AssertionResult gtest_ar_21;
  Message local_16b8;
  Script local_16b0;
  string local_1678;
  string local_1658;
  undefined1 local_1638 [8];
  AssertionResult gtest_ar_20;
  Message local_1620;
  undefined1 local_1618 [8];
  AssertionResult gtest_ar_19;
  size_t index;
  Message local_15f8;
  size_type local_15f0;
  size_type local_15e8;
  undefined1 local_15e0 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_15b8;
  Message local_15b0;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_15a8;
  size_type local_1590;
  undefined1 local_1588 [8];
  AssertionResult gtest_ar_17;
  Message local_1570;
  Script local_1568;
  string local_1530;
  string local_1510;
  undefined1 local_14f0 [8];
  AssertionResult gtest_ar_16;
  Message local_14d8;
  string local_14d0;
  undefined1 local_14b0 [8];
  AssertionResult gtest_ar_15;
  Message local_1498;
  ByteData256 local_1490;
  string local_1478;
  undefined1 local_1458 [8];
  AssertionResult gtest_ar_14;
  allocator local_1421;
  string local_1420;
  TaprootScriptTree local_1400;
  undefined1 local_1370 [8];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ScopedTrace local_1331;
  reference pTStack_1330;
  ScopedTrace gtest_trace_527;
  TestScriptTree3Data *test_data;
  iterator __end1_1;
  iterator __begin1_1;
  vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *__range1_1;
  Message local_1308;
  string local_1300;
  undefined1 local_12e0 [8];
  AssertionResult gtest_ar_13;
  Message local_12c8;
  undefined1 local_12c0 [8];
  AssertionResult gtest_ar_12;
  ByteData256 *node;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range1;
  string nodes_str;
  Message local_1230;
  string local_1228;
  undefined1 local_1208 [8];
  AssertionResult gtest_ar_11;
  Message local_11f0;
  ByteData256 local_11e8;
  string local_11d0;
  undefined1 local_11b0 [8];
  AssertionResult gtest_ar_10;
  TaprootScriptTree tree;
  undefined1 local_1080 [8];
  ByteData256 hash_abcd;
  TaprootScriptTree local_fd8;
  TaprootScriptTree local_f48;
  undefined1 local_eb8 [8];
  TaprootScriptTree tree_b;
  Message local_e20;
  ByteData256 local_e18;
  string local_e00;
  undefined1 local_de0 [8];
  AssertionResult gtest_ar_9;
  TaprootScriptTree tree_efg;
  undefined1 local_cb0 [8];
  TaprootScriptTree tree_fg;
  char *exp_str;
  char *exp_hash;
  string local_c08;
  allocator local_be1;
  string local_be0;
  allocator local_bb9;
  string local_bb8;
  ByteData256 *local_b98;
  ByteData256 local_b90;
  ByteData256 local_b78;
  ByteData256 local_b60;
  undefined1 local_b48 [19];
  undefined1 local_b35;
  undefined1 local_b34;
  allocator<cfd::core::ByteData256> local_b33;
  undefined1 local_b32;
  allocator local_b31;
  string local_b30;
  allocator local_b09;
  string local_b08;
  allocator local_ae1;
  string local_ae0;
  allocator local_ab9;
  string local_ab8;
  allocator local_a91;
  string local_a90;
  ByteData256 *local_a70;
  ByteData256 local_a68;
  ByteData256 local_a50;
  ByteData256 local_a38;
  ByteData256 local_a20;
  ByteData256 local_a08;
  undefined1 local_9f0 [24];
  TestScriptTree3Data *local_9d8;
  TestScriptTree3Data local_9d0;
  string local_958 [32];
  Script SStack_938;
  undefined8 local_900;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> vStack_8f8;
  iterator local_8e0;
  size_type local_8d8;
  undefined1 local_8d0 [8];
  vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> exp_list;
  Message local_8b0;
  string local_8a8;
  undefined1 local_888 [8];
  AssertionResult gtest_ar_8;
  Message local_870;
  string local_868;
  undefined1 local_848 [8];
  AssertionResult gtest_ar_7;
  Message local_830;
  string local_828;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_6;
  Message local_7f0;
  string local_7e8;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_5;
  Message local_7b0;
  string local_7a8;
  undefined1 local_788 [8];
  AssertionResult gtest_ar_4;
  Message local_770;
  string local_768;
  undefined1 local_748 [8];
  AssertionResult gtest_ar_3;
  Message local_730;
  string local_728;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_2;
  Message local_6f0;
  string local_6e8;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_1;
  Message local_6b0;
  string local_6a8;
  undefined1 local_688 [8];
  AssertionResult gtest_ar;
  ScriptBuilder local_660;
  undefined1 local_640 [8];
  Script script_j;
  ByteData local_5f0;
  ScriptBuilder local_5d8;
  undefined1 local_5b8 [8];
  Script script_h;
  ScriptBuilder local_568;
  undefined1 local_548 [8];
  Script script_g;
  ScriptBuilder local_4f8;
  undefined1 local_4d8 [8];
  Script script_f;
  undefined1 local_480 [8];
  Script script_e;
  ByteData local_430;
  ScriptBuilder local_418;
  undefined1 local_3f8 [8];
  Script script_d;
  ScriptBuilder local_3a8;
  undefined1 local_388 [8];
  Script script_c;
  undefined1 local_330 [8];
  Script script_b;
  ScriptBuilder local_2e0;
  undefined1 local_2c0 [8];
  Script script_a;
  SchnorrPubkey schnorr_pubkey32;
  SchnorrPubkey schnorr_pubkey31;
  SchnorrPubkey schnorr_pubkey3;
  SchnorrPubkey schnorr_pubkey22;
  SchnorrPubkey schnorr_pubkey21;
  SchnorrPubkey schnorr_pubkey2;
  SchnorrPubkey schnorr_pubkey12;
  SchnorrPubkey schnorr_pubkey11;
  SchnorrPubkey schnorr_pubkey1;
  Pubkey pubkey3;
  Pubkey pubkey2;
  Pubkey pubkey1;
  string local_160;
  undefined1 local_140 [8];
  ByteData256 tweak4;
  string local_120;
  undefined1 local_100 [8];
  ByteData256 tweak3;
  string local_e0;
  undefined1 local_c0 [8];
  ByteData256 tweak2;
  string local_a0;
  undefined1 local_80 [8];
  ByteData256 tweak1;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootScriptTree_TreeTest3_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)
             ((long)&tweak2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)
             ((long)&tweak3.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak3.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475"
             ,(allocator *)
              ((long)&tweak4.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_100,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak4.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e"
             ,(allocator *)
              ((long)&pubkey1.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pubkey1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::GeneratePubkey
            ((Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_30,true);
  cfd::core::operator+
            ((Pubkey *)
             &pubkey3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_100);
  cfd::core::operator+
            ((Pubkey *)
             &schnorr_pubkey1.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_140);
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey12.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_80);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey2.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_c0);
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pubkey3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey22.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_80);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_c0);
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey31.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &schnorr_pubkey1.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(bool *)0x0);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey32.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey31.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_80);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &script_a.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey31.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_c0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_2e0);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_b.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (&local_2e0,
                      (ByteData *)
                      &script_b.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_2c0,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_b.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_2e0);
  cfd::core::ScriptBuilder::ScriptBuilder
            ((ScriptBuilder *)
             &script_c.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     ((ScriptBuilder *)
                      &script_c.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)local_330,pSVar4);
  cfd::core::ScriptBuilder::~ScriptBuilder
            ((ScriptBuilder *)
             &script_c.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_3a8);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_d.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey12.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (&local_3a8,
                      (ByteData *)
                      &script_d.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_388,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_d.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_3a8);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_418);
  cfd::core::SchnorrPubkey::GetData
            (&local_430,
             (SchnorrPubkey *)
             &schnorr_pubkey12.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<(&local_418,&local_430);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_e.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey2.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ByteData *)
                             &script_e.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_3f8,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_e.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData(&local_430);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_418);
  cfd::core::ScriptBuilder::ScriptBuilder
            ((ScriptBuilder *)
             &script_f.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     ((ScriptBuilder *)
                      &script_f.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)local_480,pSVar4);
  cfd::core::ScriptBuilder::~ScriptBuilder
            ((ScriptBuilder *)
             &script_f.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_4f8);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_g.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey22.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (&local_4f8,
                      (ByteData *)
                      &script_g.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_4d8,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_g.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_4f8);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_568);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_h.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (&local_568,
                      (ByteData *)
                      &script_h.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_548,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_h.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_568);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_5d8);
  cfd::core::SchnorrPubkey::GetData
            (&local_5f0,
             (SchnorrPubkey *)
             &schnorr_pubkey32.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<(&local_5d8,&local_5f0);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_j.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &script_a.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ByteData *)
                             &script_j.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_5b8,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_j.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData(&local_5f0);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_5d8);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_660);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)&gtest_ar.message_,
             (SchnorrPubkey *)
             &script_a.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<(&local_660,(ByteData *)&gtest_ar.message_);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_640,pSVar4);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_660);
  cfd::core::Script::GetHex_abi_cxx11_(&local_6a8,(Script *)local_2c0);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_688,
             "\"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac\"",
             "script_a.GetHex()",
             (char (*) [69])"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
             &local_6a8);
  std::__cxx11::string::~string((string *)&local_6a8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar3) {
    testing::Message::Message(&local_6b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  cfd::core::Script::GetHex_abi_cxx11_(&local_6e8,(Script *)local_330);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_6c8,"\"51\"","script_b.GetHex()",(char (*) [3])0x73b9ee,
             &local_6e8);
  std::__cxx11::string::~string((string *)&local_6e8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
  if (!bVar3) {
    testing::Message::Message(&local_6f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_728,(Script *)local_388);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_708,
             "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac\"",
             "script_c.GetHex()",
             (char (*) [69])"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac",
             &local_728);
  std::__cxx11::string::~string((string *)&local_728);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar3) {
    testing::Message::Message(&local_730);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  cfd::core::Script::GetHex_abi_cxx11_(&local_768,(Script *)local_3f8);
  testing::internal::EqHelper<false>::Compare<char[137],std::__cxx11::string>
            ((EqHelper<false> *)local_748,
             "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac\""
             ,"script_d.GetHex()",
             (char (*) [137])
             "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
             ,&local_768);
  std::__cxx11::string::~string((string *)&local_768);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar3) {
    testing::Message::Message(&local_770);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  cfd::core::Script::GetHex_abi_cxx11_(&local_7a8,(Script *)local_480);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_788,"\"51\"","script_e.GetHex()",(char (*) [3])0x73b9ee,
             &local_7a8);
  std::__cxx11::string::~string((string *)&local_7a8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar3) {
    testing::Message::Message(&local_7b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_788);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_7b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  cfd::core::Script::GetHex_abi_cxx11_(&local_7e8,(Script *)local_4d8);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_7c8,
             "\"2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac\"",
             "script_f.GetHex()",
             (char (*) [69])"2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac",
             &local_7e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar3) {
    testing::Message::Message(&local_7f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_828,(Script *)local_548);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_808,
             "\"204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac\"",
             "script_g.GetHex()",
             (char (*) [69])"204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac",
             &local_828);
  std::__cxx11::string::~string((string *)&local_828);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar3) {
    testing::Message::Message(&local_830);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  cfd::core::Script::GetHex_abi_cxx11_(&local_868,(Script *)local_5b8);
  testing::internal::EqHelper<false>::Compare<char[137],std::__cxx11::string>
            ((EqHelper<false> *)local_848,
             "\"2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac\""
             ,"script_h.GetHex()",
             (char (*) [137])
             "2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac"
             ,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
  if (!bVar3) {
    testing::Message::Message(&local_870);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_870);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
  cfd::core::Script::GetHex_abi_cxx11_(&local_8a8,(Script *)local_640);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_888,
             "\"20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac\"",
             "script_j.GetHex()",(char (*) [69])0x6eeceb,&local_8a8);
  std::__cxx11::string::~string((string *)&local_8a8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
  if (!bVar3) {
    testing::Message::Message(&local_8b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_888);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &exp_list.
                super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1d8,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &exp_list.
                super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &exp_list.
                super__Vector_base<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
  exp_hash._2_1_ = 1;
  local_9d8 = &local_9d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9d0,"b",(allocator *)(local_9f0 + 0x17));
  local_b35 = 1;
  cfd::core::Script::Script(&local_9d0.script,(Script *)local_330);
  local_b34 = 1;
  local_9d0.depth = 5;
  local_b32 = 1;
  local_a70 = &local_a68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a90,"06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df"
             ,&local_a91);
  cfd::core::ByteData256::ByteData256(&local_a68,&local_a90);
  local_a70 = &local_a50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ab8,"4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd"
             ,&local_ab9);
  cfd::core::ByteData256::ByteData256(&local_a50,&local_ab8);
  local_a70 = &local_a38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ae0,"e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb"
             ,&local_ae1);
  cfd::core::ByteData256::ByteData256(&local_a38,&local_ae0);
  local_a70 = &local_a20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b08,"32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7c"
             ,&local_b09);
  cfd::core::ByteData256::ByteData256(&local_a20,&local_b08);
  local_a70 = &local_a08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b30,"d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_b31);
  cfd::core::ByteData256::ByteData256(&local_a08,&local_b30);
  local_b32 = 0;
  local_9f0._0_8_ = &local_a68;
  local_9f0._8_8_ = (pointer)0x5;
  std::allocator<cfd::core::ByteData256>::allocator(&local_b33);
  __l_00._M_len = local_9f0._8_8_;
  __l_00._M_array = (iterator)local_9f0._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&local_9d0.nodes,__l_00,&local_b33);
  local_b34 = 0;
  local_b35 = 0;
  local_9d8 = (TestScriptTree3Data *)local_958;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_958,"e",(allocator *)(local_b48 + 0x12));
  exp_hash._3_1_ = 1;
  cfd::core::Script::Script(&SStack_938,(Script *)local_480);
  exp_hash._4_1_ = 1;
  local_900 = 3;
  exp_hash._6_1_ = 1;
  local_b98 = &local_b90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bb8,"aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086"
             ,&local_bb9);
  cfd::core::ByteData256::ByteData256(&local_b90,&local_bb8);
  local_b98 = &local_b78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_be0,"aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e"
             ,&local_be1);
  cfd::core::ByteData256::ByteData256(&local_b78,&local_be0);
  local_b98 = &local_b60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c08,"d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,(allocator *)((long)&exp_hash + 7));
  cfd::core::ByteData256::ByteData256(&local_b60,&local_c08);
  exp_hash._6_1_ = 0;
  local_b48._0_8_ = &local_b90;
  local_b48._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::ByteData256>::allocator
            ((allocator<cfd::core::ByteData256> *)((long)&exp_hash + 5));
  __l._M_len = local_b48._8_8_;
  __l._M_array = (iterator)local_b48._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&vStack_8f8,__l,(allocator<cfd::core::ByteData256> *)((long)&exp_hash + 5));
  exp_hash._4_1_ = 0;
  exp_hash._3_1_ = 0;
  exp_hash._2_1_ = 0;
  local_8e0 = &local_9d0;
  local_8d8 = 2;
  std::allocator<TestScriptTree3Data>::allocator
            ((allocator<TestScriptTree3Data> *)((long)&exp_hash + 1));
  __l_01._M_len = local_8d8;
  __l_01._M_array = local_8e0;
  std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::vector
            ((vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *)local_8d0,__l_01,
             (allocator<TestScriptTree3Data> *)((long)&exp_hash + 1));
  std::allocator<TestScriptTree3Data>::~allocator
            ((allocator<TestScriptTree3Data> *)((long)&exp_hash + 1));
  local_1e18 = (TestScriptTree3Data *)&local_8e0;
  do {
    local_1e18 = local_1e18 + -1;
    TestBody::TestScriptTree3Data::~TestScriptTree3Data(local_1e18);
  } while (local_1e18 != &local_9d0);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)((long)&exp_hash + 5));
  local_1e30 = (ByteData256 *)local_b48;
  do {
    local_1e30 = local_1e30 + -1;
    cfd::core::ByteData256::~ByteData256(local_1e30);
  } while (local_1e30 != &local_b90);
  std::__cxx11::string::~string((string *)&local_c08);
  std::allocator<char>::~allocator((allocator<char> *)((long)&exp_hash + 7));
  std::__cxx11::string::~string((string *)&local_be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_be1);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
  std::allocator<char>::~allocator((allocator<char> *)(local_b48 + 0x12));
  std::allocator<cfd::core::ByteData256>::~allocator(&local_b33);
  local_1e48 = (ByteData256 *)local_9f0;
  do {
    local_1e48 = local_1e48 + -1;
    cfd::core::ByteData256::~ByteData256(local_1e48);
  } while (local_1e48 != &local_a68);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_b31);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  std::allocator<char>::~allocator((allocator<char> *)(local_9f0 + 0x17));
  exp_str = "0c1bebfc9a508bf4d5835d401d96d71b72f1873fd338aebfff06d7adbe0c0cc3";
  tree_fg.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_19fcc1;
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_cb0,(Script *)local_4d8);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &tree_efg.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_548);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)local_cb0,
             (TaprootScriptTree *)
             &tree_efg.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &tree_efg.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_9.message_,(Script *)local_480);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_9.message_,(TaprootScriptTree *)local_cb0);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_e18,(TapBranch *)local_cb0);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_e00,&local_e18);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_de0,
             "\"aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086\"",
             "tree_fg.GetCurrentBranchHash().GetHex()",
             (char (*) [65])"aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086",
             &local_e00);
  std::__cxx11::string::~string((string *)&local_e00);
  cfd::core::ByteData256::~ByteData256(&local_e18);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_de0);
  if (!bVar3) {
    testing::Message::Message(&local_e20);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_de0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tree_b.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1fc,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tree_b.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_e20);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tree_b.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_e20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_de0);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_eb8,(Script *)local_330);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&local_f48,(Script *)local_388);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_eb8,&local_f48);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_f48);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&local_fd8,(Script *)local_2c0);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_eb8,&local_fd8);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_fd8);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &hash_abcd.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_3f8);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)local_eb8,
             (TaprootScriptTree *)
             &hash_abcd.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &hash_abcd.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)local_1080,(TapBranch *)local_eb8);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)local_eb8,(TaprootScriptTree *)&gtest_ar_9.message_);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_5b8);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)local_eb8,
             (TaprootScriptTree *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_10.message_,(TaprootScriptTree *)local_eb8);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_11e8,(TapBranch *)&gtest_ar_10.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_11d0,&local_11e8);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_11b0,"exp_hash","tree.GetCurrentBranchHash().GetHex()",
             &exp_str,&local_11d0);
  std::__cxx11::string::~string((string *)&local_11d0);
  cfd::core::ByteData256::~ByteData256(&local_11e8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b0);
  if (!bVar3) {
    testing::Message::Message(&local_11f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_11b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x207,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_11f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_11f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b0);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_1228,(TapBranch *)&gtest_ar_10.message_);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_1208,"exp_str","tree.ToString()",
             (char **)&tree_fg.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1228);
  std::__cxx11::string::~string((string *)&local_1228);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1208);
  if (!bVar3) {
    testing::Message::Message(&local_1230);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&nodes_str.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x208,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&nodes_str.field_2 + 8),&local_1230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&nodes_str.field_2 + 8));
    testing::Message::~Message(&local_1230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1208);
  std::__cxx11::string::string((string *)&__range1);
  cfd::core::TaprootScriptTree::GetNodeList
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&__begin1,
             (TaprootScriptTree *)&gtest_ar_10.message_);
  __end1 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      &__begin1);
  node = (ByteData256 *)
         std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                   ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                    &__begin1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                     *)&node), bVar3) {
    this_00 = __gnu_cxx::
              __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
              ::operator*(&__end1);
    cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_12.message_,this_00);
    std::__cxx11::string::operator+=((string *)&__range1,(string *)&gtest_ar_12.message_);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    __gnu_cxx::
    __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
    ::operator++(&__end1);
  }
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&__begin1);
  testing::internal::EqHelper<false>::Compare<char[321],std::__cxx11::string>
            ((EqHelper<false> *)local_12c0,
             "\"06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7cd7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75\""
             ,"nodes_str",
             (char (*) [321])
             "06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7cd7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c0);
  if (!bVar3) {
    testing::Message::Message(&local_12c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_12c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x20b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_12c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_12c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c0);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1300,(ByteData256 *)local_1080);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_12e0,
             "\"aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e\"",
             "hash_abcd.GetHex()",
             (char (*) [65])"aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e",
             &local_1300);
  std::__cxx11::string::~string((string *)&local_1300);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12e0);
  if (!bVar3) {
    testing::Message::Message(&local_1308);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_12e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x20c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_1,&local_1308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_1);
    testing::Message::~Message(&local_1308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12e0);
  __end1_1 = std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::begin
                       ((vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *)
                        local_8d0);
  test_data = (TestScriptTree3Data *)
              std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::end
                        ((vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *)
                         local_8d0);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<TestScriptTree3Data_*,_std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>_>
                             *)&test_data),
        pBVar2 = tree_fg.nodes_.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage, bVar3) {
    pTStack_1330 = __gnu_cxx::
                   __normal_iterator<TestScriptTree3Data_*,_std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>_>
                   ::operator*(&__end1_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &nodes.
                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"script_",&pTStack_1330->name
                  );
    testing::ScopedTrace::ScopedTrace
              (&local_1331,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x20f,(string *)
                      &nodes.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &nodes.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_1370
              );
    pBVar2 = tree_fg.nodes_.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1420,(char *)pBVar2,&local_1421);
    tapscript = &pTStack_1330->script;
    gtest_ar_14.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_14.message_);
    cfd::core::TaprootScriptTree::FromString
              (&local_1400,&local_1420,tapscript,
               (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_14.message_);
    cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_10.message_,&local_1400);
    cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_1400);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_14.message_);
    std::__cxx11::string::~string((string *)&local_1420);
    std::allocator<char>::~allocator((allocator<char> *)&local_1421);
    cfd::core::TapBranch::GetCurrentBranchHash(&local_1490,(TapBranch *)&gtest_ar_10.message_);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1478,&local_1490);
    testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
              ((EqHelper<false> *)local_1458,"exp_hash","tree.GetCurrentBranchHash().GetHex()",
               &exp_str,&local_1478);
    std::__cxx11::string::~string((string *)&local_1478);
    cfd::core::ByteData256::~ByteData256(&local_1490);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1458);
    if (!bVar3) {
      testing::Message::Message(&local_1498);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1458);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x212,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_1498);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
      testing::Message::~Message(&local_1498);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1458);
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_14d0,(TapBranch *)&gtest_ar_10.message_);
    testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
              ((EqHelper<false> *)local_14b0,"exp_str","tree.ToString()",
               (char **)&tree_fg.nodes_.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_14d0);
    std::__cxx11::string::~string((string *)&local_14d0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b0);
    if (!bVar3) {
      testing::Message::Message(&local_14d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_14b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x213,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_14d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
      testing::Message::~Message(&local_14d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b0);
    bVar3 = std::operator==(&pTStack_1330->name,"b");
    if (bVar3) {
      pvVar6 = std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::operator[]
                         ((vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *)
                          local_8d0,1);
      cfd::core::Script::GetHex_abi_cxx11_(&local_1510,&pvVar6->script);
      cfd::core::TapBranch::GetScript(&local_1568,(TapBranch *)&gtest_ar_10.message_);
      cfd::core::Script::GetHex_abi_cxx11_(&local_1530,&local_1568);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_14f0,"exp_list[1].script.GetHex()",
                 "tree.GetScript().GetHex()",&local_1510,&local_1530);
      std::__cxx11::string::~string((string *)&local_1530);
      cfd::core::Script::~Script(&local_1568);
      std::__cxx11::string::~string((string *)&local_1510);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14f0);
      if (!bVar3) {
        testing::Message::Message(&local_1570);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_14f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x216,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_17.message_,&local_1570);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
        testing::Message::~Message(&local_1570);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_14f0);
      pvVar6 = std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::operator[]
                         ((vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *)
                          local_8d0,1);
      cfd::core::TapBranch::GetBranchList(&local_15a8,(TapBranch *)&gtest_ar_10.message_);
      local_1590 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                             (&local_15a8);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_1588,"exp_list[1].depth","tree.GetBranchList().size()",
                 &pvVar6->depth,&local_1590);
      std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_15a8)
      ;
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1588);
      if (!bVar3) {
        testing::Message::Message(&local_15b0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1588);
        testing::internal::AssertHelper::AssertHelper
                  (&local_15b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x217,pcVar5);
        testing::internal::AssertHelper::operator=(&local_15b8,&local_15b0);
        testing::internal::AssertHelper::~AssertHelper(&local_15b8);
        testing::Message::~Message(&local_15b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1588);
      cfd::core::TaprootScriptTree::GetNodeList
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_18.message_,(TaprootScriptTree *)&gtest_ar_10.message_);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 local_1370,
                 (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_18.message_);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_18.message_);
      pvVar6 = std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::operator[]
                         ((vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *)
                          local_8d0,1);
      local_15e8 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   size(&pvVar6->nodes);
      local_15f0 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        local_1370);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_15e0,"exp_list[1].nodes.size()","nodes.size()",&local_15e8
                 ,&local_15f0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15e0);
      if (!bVar3) {
        testing::Message::Message(&local_15f8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_15e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&index,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x219,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&index,&local_15f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index);
        testing::Message::~Message(&local_15f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_15e0);
      for (gtest_ar_19.message_.ptr_ =
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          sVar1.ptr_ = gtest_ar_19.message_.ptr_,
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        local_1370), sVar1.ptr_ < pbVar8;
          gtest_ar_19.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(gtest_ar_19.message_.ptr_)->field_0x1) {
        pvVar6 = std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::operator[]
                           ((vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *)
                            local_8d0,1);
        pvVar10 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                  operator[](&pvVar6->nodes,(size_type)gtest_ar_19.message_.ptr_);
        rhs = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
              operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         local_1370,(size_type)gtest_ar_19.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<cfd::core::ByteData256,cfd::core::ByteData256>
                  ((EqHelper<false> *)local_1618,"exp_list[1].nodes[index]","nodes[index]",pvVar10,
                   rhs);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1618);
        if (!bVar3) {
          testing::Message::Message(&local_1620);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1618);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                     ,0x21b,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_20.message_,&local_1620);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
          testing::Message::~Message(&local_1620);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1618);
      }
    }
    else {
      cfd::core::Script::GetHex_abi_cxx11_(&local_1658,&pTStack_1330->script);
      cfd::core::TapBranch::GetScript(&local_16b0,(TapBranch *)&gtest_ar_10.message_);
      cfd::core::Script::GetHex_abi_cxx11_(&local_1678,&local_16b0);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_1638,"test_data.script.GetHex()",
                 "tree.GetScript().GetHex()",&local_1658,&local_1678);
      std::__cxx11::string::~string((string *)&local_1678);
      cfd::core::Script::~Script(&local_16b0);
      std::__cxx11::string::~string((string *)&local_1658);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1638);
      if (!bVar3) {
        testing::Message::Message(&local_16b8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1638);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x21e,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_21.message_,&local_16b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
        testing::Message::~Message(&local_16b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1638);
      psVar7 = &pTStack_1330->depth;
      cfd::core::TapBranch::GetBranchList(&local_16f0,(TapBranch *)&gtest_ar_10.message_);
      local_16d8 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                             (&local_16f0);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_16d0,"test_data.depth","tree.GetBranchList().size()",
                 psVar7,&local_16d8);
      std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_16f0)
      ;
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16d0);
      if (!bVar3) {
        testing::Message::Message(&local_16f8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_16d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1700,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x21f,pcVar5);
        testing::internal::AssertHelper::operator=(&local_1700,&local_16f8);
        testing::internal::AssertHelper::~AssertHelper(&local_1700);
        testing::Message::~Message(&local_16f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_16d0);
      cfd::core::TaprootScriptTree::GetNodeList
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_22.message_,(TaprootScriptTree *)&gtest_ar_10.message_);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 local_1370,
                 (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_22.message_);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_22.message_);
      local_1730 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   size(&pTStack_1330->nodes);
      local_1738 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        local_1370);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_1728,"test_data.nodes.size()","nodes.size()",&local_1730,
                 &local_1738);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1728);
      if (!bVar3) {
        testing::Message::Message(&local_1740);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1728);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&index_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x221,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&index_1,&local_1740);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index_1);
        testing::Message::~Message(&local_1740);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1728);
      for (gtest_ar_23.message_.ptr_ =
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          sVar1.ptr_ = gtest_ar_23.message_.ptr_,
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        local_1370), sVar1.ptr_ < pbVar8;
          gtest_ar_23.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(gtest_ar_23.message_.ptr_)->field_0x1) {
        pvVar9 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                 operator[](&pTStack_1330->nodes,(size_type)gtest_ar_23.message_.ptr_);
        pvVar10 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                  operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              *)local_1370,(size_type)gtest_ar_23.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<cfd::core::ByteData256,cfd::core::ByteData256>
                  ((EqHelper<false> *)local_1760,"test_data.nodes[index]","nodes[index]",pvVar9,
                   pvVar10);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1760);
        if (!bVar3) {
          testing::Message::Message(&local_1768);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1760);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1770,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                     ,0x223,pcVar5);
          testing::internal::AssertHelper::operator=(&local_1770,&local_1768);
          testing::internal::AssertHelper::~AssertHelper(&local_1770);
          testing::Message::~Message(&local_1768);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1760);
      }
    }
    pBVar2 = tree_fg.nodes_.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1820,(char *)pBVar2,
               (allocator *)((long)&gtest_ar_24.message_.ptr_ + 7));
    cfd::core::TaprootScriptTree::FromString
              (&local_1800,&local_1820,&pTStack_1330->script,&pTStack_1330->nodes);
    cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_10.message_,&local_1800);
    cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_1800);
    std::__cxx11::string::~string((string *)&local_1820);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_24.message_.ptr_ + 7));
    cfd::core::TapBranch::GetCurrentBranchHash(&local_1870,(TapBranch *)&gtest_ar_10.message_);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1858,&local_1870);
    testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
              ((EqHelper<false> *)local_1838,"exp_hash","tree.GetCurrentBranchHash().GetHex()",
               &exp_str,&local_1858);
    std::__cxx11::string::~string((string *)&local_1858);
    cfd::core::ByteData256::~ByteData256(&local_1870);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1838);
    if (!bVar3) {
      testing::Message::Message(&local_1878);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1838);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x22a,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_1878);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
      testing::Message::~Message(&local_1878);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1838);
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_18b0,(TapBranch *)&gtest_ar_10.message_);
    testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
              ((EqHelper<false> *)local_1890,"exp_str","tree.ToString()",
               (char **)&tree_fg.nodes_.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_18b0);
    std::__cxx11::string::~string((string *)&local_18b0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1890);
    if (!bVar3) {
      testing::Message::Message(&local_18b8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1890);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x22b,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_18b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
      testing::Message::~Message(&local_18b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1890);
    cfd::core::Script::GetHex_abi_cxx11_(&local_18f0,&pTStack_1330->script);
    cfd::core::TapBranch::GetScript(&local_1948,(TapBranch *)&gtest_ar_10.message_);
    cfd::core::Script::GetHex_abi_cxx11_(&local_1910,&local_1948);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_18d0,"test_data.script.GetHex()","tree.GetScript().GetHex()"
               ,&local_18f0,&local_1910);
    std::__cxx11::string::~string((string *)&local_1910);
    cfd::core::Script::~Script(&local_1948);
    std::__cxx11::string::~string((string *)&local_18f0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18d0);
    if (!bVar3) {
      testing::Message::Message(&local_1950);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_18d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x22c,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_1950);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
      testing::Message::~Message(&local_1950);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_18d0);
    psVar7 = &pTStack_1330->depth;
    cfd::core::TapBranch::GetBranchList(&local_1988,(TapBranch *)&gtest_ar_10.message_);
    local_1970 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                           (&local_1988);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_1968,"test_data.depth","tree.GetBranchList().size()",psVar7,
               &local_1970);
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_1988);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1968);
    if (!bVar3) {
      testing::Message::Message(&local_1990);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1968);
      testing::internal::AssertHelper::AssertHelper
                (&local_1998,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x22d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1998,&local_1990);
      testing::internal::AssertHelper::~AssertHelper(&local_1998);
      testing::Message::~Message(&local_1990);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1968);
    cfd::core::TaprootScriptTree::GetNodeList
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_28.message_,(TaprootScriptTree *)&gtest_ar_10.message_);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_1370
               ,(vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                &gtest_ar_28.message_);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_28.message_);
    local_19c8 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                           (&pTStack_1330->nodes);
    local_19d0 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                           ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             *)local_1370);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_19c0,"test_data.nodes.size()","nodes.size()",&local_19c8,
               &local_19d0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19c0);
    if (!bVar3) {
      testing::Message::Message(&local_19d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_19c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&index_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x22f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&index_2,&local_19d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index_2);
      testing::Message::~Message(&local_19d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_19c0);
    for (gtest_ar_29.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar1.ptr_ = gtest_ar_29.message_.ptr_,
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                           ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             *)local_1370), sVar1.ptr_ < pbVar8;
        gtest_ar_29.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar_29.message_.ptr_)->field_0x1) {
      pvVar9 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
               operator[](&pTStack_1330->nodes,(size_type)gtest_ar_29.message_.ptr_);
      pvVar10 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                            *)local_1370,(size_type)gtest_ar_29.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<cfd::core::ByteData256,cfd::core::ByteData256>
                ((EqHelper<false> *)local_19f8,"test_data.nodes[index]","nodes[index]",pvVar9,
                 pvVar10);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19f8);
      if (!bVar3) {
        testing::Message::Message(&local_1a00);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_19f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&except_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x231,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&except_1,&local_1a00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_1);
        testing::Message::~Message(&local_1a00);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_19f8);
    }
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_1370
              );
    testing::ScopedTrace::~ScopedTrace(&local_1331);
    __gnu_cxx::
    __normal_iterator<TestScriptTree3Data_*,_std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>_>
    ::operator++(&__end1_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ae0,(char *)pBVar2,&local_1ae1);
  gtest_ar_31.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_31.message_);
  cfd::core::TaprootScriptTree::FromString
            (&local_1ac0,&local_1ae0,(Script *)local_640,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_31.message_);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_10.message_,&local_1ac0);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_1ac0);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_31.message_);
  std::__cxx11::string::~string((string *)&local_1ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ae1);
  cfd::core::TapBranch::GetScript(&local_1b70,(TapBranch *)&gtest_ar_10.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_1b38,&local_1b70);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_1b18,"\"xxx\"","tree.GetScript().GetHex()",
             (char (*) [4])0x6e19c7,&local_1b38);
  std::__cxx11::string::~string((string *)&local_1b38);
  cfd::core::Script::~Script(&local_1b70);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b18);
  if (!bVar3) {
    testing::Message::Message(&local_1b78);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x23a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_1b78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_1b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b18);
  cfd::core::Script::GetHex_abi_cxx11_(&local_1bb0,(Script *)local_640);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_1b90,"\"xxx\"","script_j.GetHex()",(char (*) [4])0x6e19c7,
             &local_1bb0);
  std::__cxx11::string::~string((string *)&local_1bb0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b90);
  if (!bVar3) {
    testing::Message::Message(&local_1bb8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x23b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_1bb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
    testing::Message::~Message(&local_1bb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b90);
  std::__cxx11::string::~string((string *)&__range1);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_10.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_1080);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_eb8);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_9.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_cb0);
  std::vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_>::~vector
            ((vector<TestScriptTree3Data,_std::allocator<TestScriptTree3Data>_> *)local_8d0);
  cfd::core::Script::~Script((Script *)local_640);
  cfd::core::Script::~Script((Script *)local_5b8);
  cfd::core::Script::~Script((Script *)local_548);
  cfd::core::Script::~Script((Script *)local_4d8);
  cfd::core::Script::~Script((Script *)local_480);
  cfd::core::Script::~Script((Script *)local_3f8);
  cfd::core::Script::~Script((Script *)local_388);
  cfd::core::Script::~Script((Script *)local_330);
  cfd::core::Script::~Script((Script *)local_2c0);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &script_a.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey32.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey31.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey22.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey2.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey12.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &schnorr_pubkey1.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pubkey3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_140);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_100);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_c0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest3) {
  //        /\        //
  //       /\ H       //
  //      /  \        //
  //     /\  /\       //
  //    /  D E \      //
  //   / \     /\     //
  //  A   /\  F  G    //
  //     B  C         //
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  ByteData256 tweak3("a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475");
  ByteData256 tweak4("4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e");
  Pubkey pubkey1 = key.GeneratePubkey();
  Pubkey pubkey2 = pubkey1 + tweak3;
  Pubkey pubkey3 = pubkey1 + tweak4;
  SchnorrPubkey schnorr_pubkey1 = SchnorrPubkey::FromPubkey(pubkey1);
  SchnorrPubkey schnorr_pubkey11 = schnorr_pubkey1 + tweak1;
  SchnorrPubkey schnorr_pubkey12 = schnorr_pubkey1 + tweak2;
  SchnorrPubkey schnorr_pubkey2 = SchnorrPubkey::FromPubkey(pubkey2);
  SchnorrPubkey schnorr_pubkey21 = schnorr_pubkey2 + tweak1;
  SchnorrPubkey schnorr_pubkey22 = schnorr_pubkey2 + tweak2;
  SchnorrPubkey schnorr_pubkey3 = SchnorrPubkey::FromPubkey(pubkey3);
  SchnorrPubkey schnorr_pubkey31 = schnorr_pubkey3 + tweak1;
  SchnorrPubkey schnorr_pubkey32 = schnorr_pubkey3 + tweak2;

  Script script_a = (ScriptBuilder() << schnorr_pubkey1.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_b = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  Script script_c = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_d = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey12.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_e = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  // Script script_e = (ScriptBuilder() << schnorr_pubkey2.GetData()
  //     << ScriptOperator::OP_CHECKSIG).Build();

  Script script_f = (ScriptBuilder() << schnorr_pubkey21.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_g = (ScriptBuilder() << schnorr_pubkey22.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_h = (ScriptBuilder() << schnorr_pubkey31.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_j = (ScriptBuilder() << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  EXPECT_EQ("20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac", script_a.GetHex());
  EXPECT_EQ("51", script_b.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac", script_c.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac", script_d.GetHex());
  EXPECT_EQ("51", script_e.GetHex());
  EXPECT_EQ("2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac", script_f.GetHex());
  EXPECT_EQ("204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac", script_g.GetHex());
  EXPECT_EQ("2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_h.GetHex());
  EXPECT_EQ("20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_j.GetHex());

  struct TestScriptTree3Data {
    std::string name;
    Script script;
    size_t depth;
    std::vector<ByteData256> nodes;
  };
  std::vector<TestScriptTree3Data> exp_list = {
    {
      "b", script_b, 5,
      {
        ByteData256("06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df"),
        ByteData256("4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd"),
        ByteData256("e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb"),
        ByteData256("32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7c"),
        ByteData256("d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75")
      }
    },
    {
      "e", script_e, 3,
      {
        ByteData256("aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086"),
        ByteData256("aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e"),
        ByteData256("d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75")
      }
    },
  };

  auto exp_hash = "0c1bebfc9a508bf4d5835d401d96d71b72f1873fd338aebfff06d7adbe0c0cc3";
  auto exp_str = "{{{tl(51),{tl(204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac),tl(2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac)}},{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),{tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac),tl(51)}},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}},tl(2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac)}";

  TaprootScriptTree tree_fg(script_f);
  tree_fg.AddBranch(TaprootScriptTree(script_g));
  TaprootScriptTree tree_efg(script_e);
  tree_efg.AddBranch(tree_fg);
  EXPECT_EQ("aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086", tree_fg.GetCurrentBranchHash().GetHex());

  TaprootScriptTree tree_b(script_b);
  tree_b.AddBranch(TaprootScriptTree(script_c));
  tree_b.AddBranch(TaprootScriptTree(script_a));
  tree_b.AddBranch(TaprootScriptTree(script_d));
  auto hash_abcd = tree_b.GetCurrentBranchHash();
  tree_b.AddBranch(tree_efg);
  tree_b.AddBranch(TaprootScriptTree(script_h));

  TaprootScriptTree tree = tree_b;
  EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, tree.ToString());
  std::string nodes_str;
  for (const auto& node : tree.GetNodeList()) nodes_str += node.GetHex();
  EXPECT_EQ("06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb32a0a039ec1412be2803fd7b5f5444c03d498e5e8e107ee431a9597c7b5b3a7cd7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75", nodes_str);
  EXPECT_EQ("aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27e", hash_abcd.GetHex());

  for (const auto& test_data : exp_list) {
    SCOPED_TRACE("script_" + test_data.name);
    std::vector<ByteData256> nodes;
    tree = TaprootScriptTree::FromString(exp_str, test_data.script);
    EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
    EXPECT_EQ(exp_str, tree.ToString());
    if (test_data.name == "b") {
      // see: script_e (duplicated script)
      EXPECT_EQ(exp_list[1].script.GetHex(), tree.GetScript().GetHex());
      EXPECT_EQ(exp_list[1].depth, tree.GetBranchList().size());
      nodes = tree.GetNodeList();
      EXPECT_EQ(exp_list[1].nodes.size(), nodes.size());
      for (size_t index=0; index<nodes.size(); ++index) {
        EXPECT_EQ(exp_list[1].nodes[index], nodes[index]);
      }
    } else {
      EXPECT_EQ(test_data.script.GetHex(), tree.GetScript().GetHex());
      EXPECT_EQ(test_data.depth, tree.GetBranchList().size());
      nodes = tree.GetNodeList();
      EXPECT_EQ(test_data.nodes.size(), nodes.size());
      for (size_t index=0; index<nodes.size(); ++index) {
        EXPECT_EQ(test_data.nodes[index], nodes[index]);
      }
    }

    try {
      tree = TaprootScriptTree::FromString(
          exp_str, test_data.script, test_data.nodes);
      EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
      EXPECT_EQ(exp_str, tree.ToString());
      EXPECT_EQ(test_data.script.GetHex(), tree.GetScript().GetHex());
      EXPECT_EQ(test_data.depth, tree.GetBranchList().size());
      nodes = tree.GetNodeList();
      EXPECT_EQ(test_data.nodes.size(), nodes.size());
      for (size_t index=0; index<nodes.size(); ++index) {
        EXPECT_EQ(test_data.nodes[index], nodes[index]);
      }
    } catch (const CfdException& except) {
      EXPECT_STREQ("", except.what());
    }
  }
  // invalid leaf
  try {
    tree = TaprootScriptTree::FromString(exp_str, script_j);
    EXPECT_EQ("xxx", tree.GetScript().GetHex());
    EXPECT_EQ("xxx", script_j.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ(
      "This tapscript not exist in this tree.",
      except.what());
  }
}